

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 00-readme.cpp
# Opt level: O0

int main(void)

{
  iterator pfVar1;
  iterator pfVar2;
  ostream *poVar3;
  reference pfVar4;
  size_type sVar5;
  const_reference puVar6;
  undefined1 local_b8 [8];
  ArrayCoord coord;
  ArrayCoord local_88;
  undefined1 local_68 [8];
  Grid<float,_4UL,_2UL,_3UL> grid;
  
  multidim::_impl_multi_grid::Grid<float,_4UL,_2UL,_3UL>::Grid
            ((Grid<float,_4UL,_2UL,_3UL> *)local_68);
  pfVar1 = multidim::_impl_multi_grid::Grid<float,_4UL,_2UL,_3UL>::begin
                     ((Grid<float,_4UL,_2UL,_3UL> *)local_68);
  pfVar2 = multidim::_impl_multi_grid::Grid<float,_4UL,_2UL,_3UL>::end
                     ((Grid<float,_4UL,_2UL,_3UL> *)local_68);
  std::generate<float*,main::__0>(pfVar1,pfVar2);
  poVar3 = multidim::_impl_multi_grid::operator<<
                     ((ostream *)&std::cout,(Grid<float,_4UL,_2UL,_3UL> *)local_68);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)&std::cout,"grid[{{2,0,2}}] = ");
  local_88.data_[0] = 2;
  local_88.data_[1] = 0;
  local_88.data_[2] = 2;
  pfVar4 = multidim::_impl_multi_grid::Grid<float,_4UL,_2UL,_3UL>::operator[]
                     ((Grid<float,_4UL,_2UL,_3UL> *)local_68,&local_88);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar4);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)&std::cout,"grid.flatten({{2,0,2}}) =");
  coord.data_[2] = 2;
  sVar5 = multidim::_impl_multi_grid::Grid<float,_4UL,_2UL,_3UL>::flatten
                    ((Grid<float,_4UL,_2UL,_3UL> *)local_68,(ArrayCoord *)(coord.data_ + 2));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5);
  std::operator<<(poVar3,'\n');
  local_b8 = (undefined1  [8])0x2;
  coord.data_[0] = 0;
  coord.data_[1] = 2;
  poVar3 = std::operator<<((ostream *)&std::cout,"grid.unflatten(14) = {");
  puVar6 = multidim::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_b8,0);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*puVar6);
  poVar3 = std::operator<<(poVar3,",");
  puVar6 = multidim::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_b8,1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*puVar6);
  poVar3 = std::operator<<(poVar3,",");
  puVar6 = multidim::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_b8,2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*puVar6);
  std::operator<<(poVar3,"}\n");
  return 0;
}

Assistant:

int main() 
{
	// Create a 3D grid with 4x2x3 vertices
	multidim::Grid<float,4,2,3> grid;

	// grid behaves like a STL container and we can fill values with std::generate
	std::generate(grid.begin(), grid.end(), [](){ static float n{0.0f}; return n+=0.5f; } );

	// We have a pretty printer
	std::cout << grid << '\n';

	// We can access efficiently to values from appropriate coordinates
	std::cout << "grid[{{2,0,2}}] = " << grid[{{2,0,2}}] << '\n';

    // Access to indexes or coords are O(1)
    std::cout << "grid.flatten({{2,0,2}}) =" << grid.flatten({{2,0,2}}) << '\n';

    // Indeed it is evaluated at compile time !
    static_assert(grid.flatten({{2,0,2}}) == 14, "Should be evaluated at compile time !");

    constexpr auto coord = grid.unflatten(14);
    std::cout << "grid.unflatten(14) = {" << coord[0] << "," << coord[1] << "," << coord[2] << "}\n";
    static_assert(coord[0] == 2, "Should be evaluated at compile time !");
}